

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchQbf.cpp
# Opt level: O3

void Bmatch_PrepareFinal(Abc_Ntk_t *pNtk_Qbf,int ILP_constraint)

{
  long lVar1;
  Abc_Obj_t_ *p0;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *in_RDI;
  ulong uVar3;
  int local_24;
  Abc_Ntk_t *local_20;
  
  if ((Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
       super__Vector_impl_data._M_start) &&
     (Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    p0 = *Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
          super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)Output_Pool.
                          super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
      uVar3 = 0;
      do {
        lVar1 = uVar3 + 1;
        uVar3 = uVar3 + 1;
        p0 = Abc_AigOr((Abc_Aig_t *)in_RDI->pManFunc,p0,
                       Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar1]);
      } while (uVar3 < ((long)Output_Pool.
                              super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)Output_Pool.
                              super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) - 1U);
    }
    pAVar2 = Bmatch_Construct_ILP(&Control_Pool,&local_20,&local_24);
    pAVar2 = Abc_AigAnd((Abc_Aig_t *)in_RDI->pManFunc,(Abc_Obj_t *)((ulong)pAVar2 ^ 1),
                        (Abc_Obj_t *)((ulong)p0 ^ 1));
    pObj = Abc_NtkCreateObj(in_RDI,ABC_OBJ_PO);
    Abc_ObjAddFanin(pObj,pAVar2);
    if (Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    if (Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    Abc_AigCleanup((Abc_Aig_t *)in_RDI->pManFunc);
    Abc_NtkAddDummyPoNames(in_RDI);
    Abc_NtkAddDummyBoxNames(in_RDI);
    return;
  }
  __assert_fail("Output_Pool.size() >= 1 && Control_Pool.size() >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bmatch/bmatchQbf.cpp"
                ,0xf9,"void Bmatch_PrepareFinal(Abc_Ntk_t *, int)");
}

Assistant:

void Bmatch_PrepareFinal( Abc_Ntk_t * pNtk_Qbf, int ILP_constraint )
{
    Abc_Obj_t * pObj, * pILP, * pOutput;

    assert( Output_Pool.size() >= 1 && Control_Pool.size() >= 1);
    pObj = Output_Pool[0];
    if( Output_Pool.size() > 1){
        for( int j = 0; j < Output_Pool.size() - 1; ++j){
            pObj = Abc_AigOr( (Abc_Aig_t *)pNtk_Qbf->pManFunc, pObj, Output_Pool[j + 1]);
        }
    }

    pILP = Bmatch_Construct_ILP( Control_Pool, pNtk_Qbf, ILP_constraint);

    pObj = Abc_AigAnd( (Abc_Aig_t *)pNtk_Qbf->pManFunc, Abc_ObjNot(pILP), Abc_ObjNot(pObj) );
    pOutput = Abc_NtkCreatePo( pNtk_Qbf );
    Abc_ObjAddFanin( pOutput, pObj );

    Output_Pool.clear();
    Control_Pool.clear();

    Abc_AigCleanup( (Abc_Aig_t *)pNtk_Qbf->pManFunc );
    // Abc_NtkAddDummyPiNames( pNtk_Qbf );
    Abc_NtkAddDummyPoNames( pNtk_Qbf ); 
    Abc_NtkAddDummyBoxNames( pNtk_Qbf );
}